

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture3DView *src,float *texCoord,ReferenceParams *params)

{
  Texture3DView TVar1;
  undefined1 local_68 [8];
  Vec4 rq;
  Vec4 tq;
  Vec4 sq;
  Texture3DView view;
  ReferenceParams *params_local;
  float *texCoord_local;
  Texture3DView *src_local;
  SurfaceAccess *dst_local;
  
  TVar1 = getSubView(src,params->baseLevel,params->maxLevel);
  sq.m_data[2] = (float)TVar1.m_numLevels;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[3],texCoord[6],texCoord[9]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(rq.m_data + 2),texCoord[1],texCoord[4],texCoord[7],texCoord[10]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_68,texCoord[2],texCoord[5],texCoord[8],texCoord[0xb]);
  if (((params->super_RenderParams).flags & 1) == 0) {
    sampleTextureNonProjected
              (dst,(Texture3DView *)(sq.m_data + 2),(Vec4 *)(tq.m_data + 2),(Vec4 *)(rq.m_data + 2),
               (Vec4 *)local_68,params);
  }
  else {
    sampleTextureProjected
              (dst,(Texture3DView *)(sq.m_data + 2),(Vec4 *)(tq.m_data + 2),(Vec4 *)(rq.m_data + 2),
               (Vec4 *)local_68,params);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture3DView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::Texture3DView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	if (params.flags & ReferenceParams::PROJECTED)
		sampleTextureProjected(dst, view, sq, tq, rq, params);
	else
		sampleTextureNonProjected(dst, view, sq, tq, rq, params);
}